

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

void * ma_dr_flac__realloc_from_callbacks
                 (void *p,size_t szNew,size_t szOld,ma_allocation_callbacks *pAllocationCallbacks)

{
  void *pvVar1;
  
  if (pAllocationCallbacks != (ma_allocation_callbacks *)0x0) {
    if (pAllocationCallbacks->onRealloc != (_func_void_ptr_void_ptr_size_t_void_ptr *)0x0) {
      pvVar1 = (*pAllocationCallbacks->onRealloc)(p,szNew,pAllocationCallbacks->pUserData);
      return pvVar1;
    }
    if (((pAllocationCallbacks->onMalloc != (_func_void_ptr_size_t_void_ptr *)0x0) &&
        (pAllocationCallbacks->onFree != (_func_void_void_ptr_void_ptr *)0x0)) &&
       (pvVar1 = (*pAllocationCallbacks->onMalloc)(szNew,pAllocationCallbacks->pUserData),
       pvVar1 != (void *)0x0)) {
      memcpy(pvVar1,p,szOld);
      (*pAllocationCallbacks->onFree)(p,pAllocationCallbacks->pUserData);
      return pvVar1;
    }
  }
  return (void *)0x0;
}

Assistant:

static void* ma_dr_flac__realloc_from_callbacks(void* p, size_t szNew, size_t szOld, const ma_allocation_callbacks* pAllocationCallbacks)
{
    if (pAllocationCallbacks == NULL) {
        return NULL;
    }
    if (pAllocationCallbacks->onRealloc != NULL) {
        return pAllocationCallbacks->onRealloc(p, szNew, pAllocationCallbacks->pUserData);
    }
    if (pAllocationCallbacks->onMalloc != NULL && pAllocationCallbacks->onFree != NULL) {
        void* p2;
        p2 = pAllocationCallbacks->onMalloc(szNew, pAllocationCallbacks->pUserData);
        if (p2 == NULL) {
            return NULL;
        }
        if (p != NULL) {
            MA_DR_FLAC_COPY_MEMORY(p2, p, szOld);
            pAllocationCallbacks->onFree(p, pAllocationCallbacks->pUserData);
        }
        return p2;
    }
    return NULL;
}